

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm.c
# Opt level: O0

void asm_loop(ASMState *as)

{
  MCode *target;
  MCode *mcspill;
  ASMState *as_local;
  
  as->loopsnapno = as->snapno;
  if (as->gcsteps != 0) {
    asm_gc_check(as);
  }
  as->invmcp = (MCode *)0x0;
  as->flagmcp = (MCode *)0x0;
  as->sectref = 0;
  if (as->fuseref != 0xffffffff) {
    as->fuseref = 0;
  }
  asm_phi_shuffle(as);
  target = as->mcp;
  asm_phi_copyspill(as);
  asm_loop_fixup(as);
  as->mcloop = as->mcp;
  if (as->mcp != target) {
    emit_jmp(as,target);
  }
  return;
}

Assistant:

static void asm_loop(ASMState *as)
{
  MCode *mcspill;
  /* LOOP is a guard, so the snapno is up to date. */
  as->loopsnapno = as->snapno;
  if (as->gcsteps)
    asm_gc_check(as);
  /* LOOP marks the transition from the variant to the invariant part. */
  as->flagmcp = as->invmcp = NULL;
  as->sectref = 0;
  if (!neverfuse(as)) as->fuseref = 0;
  asm_phi_shuffle(as);
  mcspill = as->mcp;
  asm_phi_copyspill(as);
  asm_loop_fixup(as);
  as->mcloop = as->mcp;
  RA_DBGX((as, "===== LOOP ====="));
  if (!as->realign) RA_DBG_FLUSH();
  if (as->mcp != mcspill)
    emit_jmp(as, mcspill);
}